

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

float notch::core::internal::dot<float_const*,float_const*>
                (float *x_begin,float *x_end,float *y_begin,float *y_end)

{
  ulong uVar1;
  ulong uVar2;
  ostream *poVar3;
  invalid_argument *this;
  float *local_200;
  float *y;
  float *x;
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream what;
  size_t y_size;
  size_t x_size;
  double dotProduct;
  float *y_end_local;
  float *y_begin_local;
  float *x_end_local;
  float *x_begin_local;
  
  x_size = 0;
  uVar1 = ::std::distance<float_const*>(x_begin,x_end);
  uVar2 = ::std::distance<float_const*>(y_begin,y_end);
  local_200 = y_begin;
  y = x_begin;
  if (uVar1 == uVar2) {
    for (; y != x_end; y = y + 1) {
      x_size = (size_t)((double)(*y * *local_200) + (double)x_size);
      local_200 = local_200 + 1;
    }
    return (float)(double)x_size;
  }
  ::std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar3 = ::std::operator<<((ostream *)local_1b8,"stl_dot: vector sizes don\'t match:\n");
  poVar3 = ::std::operator<<(poVar3," x size = ");
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,uVar1);
  poVar3 = ::std::operator<<(poVar3," y size = ");
  ::std::ostream::operator<<(poVar3,uVar2);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::ostringstream::str();
  ::std::invalid_argument::invalid_argument(this,local_1e8);
  __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

float
INTERNAL_NOBLAS(dot)(
    VectorX_Iter x_begin, VectorX_Iter x_end,
    VectorY_Iter y_begin, VectorY_Iter y_end) {
    double dotProduct = 0.0;
    size_t x_size = std::distance(x_begin, x_end);
    size_t y_size = std::distance(y_begin, y_end);
    if (x_size != y_size) {
        std::ostringstream what;
        what << "stl_dot: vector sizes don't match:\n"
            << " x size = " << x_size
            << " y size = " << y_size;
        throw std::invalid_argument(what.str());
    }
    auto x = x_begin;
    auto y = y_begin;
    for (; x != x_end; ++x, ++y) {
        dotProduct += (*x) * (*y);
    }
    return static_cast<float>(dotProduct);
}